

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O2

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftUp_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  int iVar1;
  uint uVar2;
  Timer **ppTVar3;
  uint uVar4;
  ulong uVar5;
  
  ppTVar3 = this->m_ptrArr;
  uVar5 = (ulong)(hole_index - 1 >> 1);
  if (hole_index == 0) {
    uVar5 = 0;
  }
  while (hole_index != 0) {
    uVar4 = (uint)uVar5;
    iVar1 = (*this->m_pCmpFunc)(ppTVar3[uVar5],e);
    ppTVar3 = this->m_ptrArr;
    if (iVar1 != 1) break;
    uVar2 = uVar4 - 1 >> 1;
    if (uVar4 == 0) {
      uVar2 = 0;
    }
    ppTVar3[hole_index] = ppTVar3[uVar5];
    ppTVar3 = this->m_ptrArr;
    (ppTVar3[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
    uVar5 = (ulong)uVar2;
    hole_index = uVar4;
  }
  ppTVar3[hole_index] = e;
  (this->m_ptrArr[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
  return;
}

Assistant:

void shiftUp_(uint32_t hole_index, T* e)
	{
		uint32_t parent_index = parent(hole_index);
		// 循环向上给e找个适合的位置
		while ((hole_index > 0) && m_pCmpFunc(m_ptrArr[parent_index], e) == 1)
		{
			m_ptrArr[hole_index] = m_ptrArr[parent_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = parent_index;
			parent_index = parent(hole_index);
		}
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}